

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_algorithms_tests.hpp
# Opt level: O0

void test_parallel_for_each(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_448;
  anon_class_8_1_a7c1402f_for_func local_308;
  allocator<char> local_2f9;
  string local_2f8;
  atomic<unsigned_long> local_2d8;
  atomic<unsigned_long> count;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c8;
  undefined1 local_2c7;
  allocator<char> local_2c6;
  allocator<char> local_2c5;
  int32_t vecSize;
  allocator<char> local_2c0;
  allocator<char> local_2bf;
  allocator<char> local_2be;
  allocator<char> local_2bd;
  allocator<char> local_2bc;
  allocator<char> local_2bb;
  allocator<char> local_2ba;
  allocator<char> local_2b9;
  allocator<char> local_2b8;
  allocator<char> local_2b7;
  allocator<char> local_2b6;
  allocator<char> local_2b5 [20];
  allocator<char> local_2a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  test __t;
  
  test::test((test *)((long)&vec.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
             "test_parallel_for_each");
  local_2c7 = 1;
  local_2a0 = &local_298;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"Lorem ipsum dolor",&local_2a1);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_278," sit amet, consectetur",local_2b5);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258," adipiscing elit.",&local_2b6);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"Nullam nulla sapien,",&local_2b7);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_218," mattis a egestas id,",&local_2b8);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f8," lobortis ut mauris.",&local_2b9);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,"Proin consectetur finibus diam,",&local_2ba);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8," eu maximus velit interdum sed.",&local_2bb);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,"Quisque massa nibh, molestie vitae",&local_2bc);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178," volutpat sed, lacinia non odio.",&local_2bd);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"Aenean dui enim, porttitor quis velit quis,",&local_2be);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138," lacinia viverra ex.",&local_2bf);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"Vivamus et libero sit amet orci consequat consectetur.",&local_2c0);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"Duis eu porttitor nunc,",(allocator<char> *)((long)&vecSize + 3));
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8," nec scelerisque mi.Cras efficitur lobortis elit, id",
             (allocator<char> *)((long)&vecSize + 2));
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8," scelerisque diam interdum ut.",(allocator<char> *)((long)&vecSize + 1));
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"Quisque blandit sodales venenatis.",(allocator<char> *)&vecSize);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"Ut at purus congue dolor cursus posuere.",&local_2c5);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"Aliquam ac volutpat turpis, ac placerat nisl.",&local_2c6);
  local_2c7 = 0;
  local_38 = &local_298;
  local_30 = 0x13;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_2c8);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l,&local_2c8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_2c8);
  local_448 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_448 = local_448 + -1;
    std::__cxx11::string::~string((string *)local_448);
  } while (local_448 != &local_298);
  std::allocator<char>::~allocator(&local_2c6);
  std::allocator<char>::~allocator(&local_2c5);
  std::allocator<char>::~allocator((allocator<char> *)&vecSize);
  std::allocator<char>::~allocator((allocator<char> *)((long)&vecSize + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&vecSize + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&vecSize + 3));
  std::allocator<char>::~allocator(&local_2c0);
  std::allocator<char>::~allocator(&local_2bf);
  std::allocator<char>::~allocator(&local_2be);
  std::allocator<char>::~allocator(&local_2bd);
  std::allocator<char>::~allocator(&local_2bc);
  std::allocator<char>::~allocator(&local_2bb);
  std::allocator<char>::~allocator(&local_2ba);
  std::allocator<char>::~allocator(&local_2b9);
  std::allocator<char>::~allocator(&local_2b8);
  std::allocator<char>::~allocator(&local_2b7);
  std::allocator<char>::~allocator(&local_2b6);
  std::allocator<char>::~allocator(local_2b5);
  std::allocator<char>::~allocator(&local_2a1);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_28);
  count.super___atomic_base<unsigned_long>._M_i._4_4_ = (undefined4)sVar1;
  local_2d8.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"FibonacciParallelForEach",&local_2f9);
  local_308.count = &local_2d8;
  oqpi::
  helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
  ::
  parallel_for_each<test_parallel_for_each()::__0,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_2f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28,&local_308);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  test::~test((test *)((long)&vec.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  return;
}

Assistant:

void test_parallel_for_each()
{
    TEST_FUNC;

    std::vector<std::string> vec
    {
        "Lorem ipsum dolor",
        " sit amet, consectetur",
        " adipiscing elit.",
        "Nullam nulla sapien,",
        " mattis a egestas id,",
        " lobortis ut mauris.",
        "Proin consectetur finibus diam,",
        " eu maximus velit interdum sed.",
        "Quisque massa nibh, molestie vitae",
        " volutpat sed, lacinia non odio.",
        "Aenean dui enim, porttitor quis velit quis,",
        " lacinia viverra ex.",
        "Vivamus et libero sit amet orci consequat consectetur.",
        "Duis eu porttitor nunc,",
        " nec scelerisque mi.Cras efficitur lobortis elit, id",
        " scelerisque diam interdum ut.",
        "Quisque blandit sodales venenatis.",
        "Ut at purus congue dolor cursus posuere.",
        "Aliquam ac volutpat turpis, ac placerat nisl."
    };
    const auto vecSize = int32_t(vec.size());
    std::atomic<uint64_t> count = 0;

    oqpi_tk::parallel_for_each("FibonacciParallelForEach", vec,
        [&count](const std::string &s)
    {
        uint64_t total = 0;
        for (auto c : s)
        {
            total += uint64_t(c) * 100;
        }
        count += fibonacci(total);
    });
}